

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastMultiplier3
               (Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes,
               int fSigned,int fCla)

{
  int iVar1;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  bool local_4d;
  int local_48;
  int fCompl;
  int k;
  int i;
  Vec_Wec_t *vLevels;
  Vec_Wec_t *vProds;
  Vec_Int_t *vRes_local;
  int nArgB_local;
  int nArgA_local;
  int *pArgB_local;
  int *pArgA_local;
  Gia_Man_t *pNew_local;
  
  p = Vec_WecStart(nArgA + nArgB);
  p_00 = Vec_WecStart(nArgA + nArgB);
  for (fCompl = 0; fCompl < nArgA; fCompl = fCompl + 1) {
    for (local_48 = 0; local_48 < nArgB; local_48 = local_48 + 1) {
      local_4d = false;
      if (fSigned != 0) {
        local_4d = (fCompl == nArgA + -1) != (local_48 == nArgB + -1);
      }
      iVar1 = Gia_ManHashAnd(pNew,pArgA[fCompl],pArgB[local_48]);
      iVar1 = Abc_LitNotCond(iVar1,(uint)local_4d);
      Vec_WecPush(p,fCompl + local_48,iVar1);
      Vec_WecPush(p_00,fCompl + local_48,0);
    }
  }
  if (fSigned != 0) {
    Vec_WecPush(p,nArgA,1);
    Vec_WecPush(p_00,nArgA,0);
    Vec_WecPush(p,nArgA + nArgB + -1,1);
    Vec_WecPush(p_00,nArgA + nArgB + -1,0);
  }
  Wlc_BlastReduceMatrix(pNew,p,p_00,vRes,fSigned,fCla);
  Vec_WecFree(p);
  Vec_WecFree(p_00);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            int fCompl = fSigned && ((i == nArgA-1) ^ (k == nArgB-1));
            Vec_WecPush( vProds,  i+k, Abc_LitNotCond(Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]), fCompl) );
            Vec_WecPush( vLevels, i+k, 0 );
        }
    if ( fSigned )
    {
        Vec_WecPush( vProds,  nArgA, 1 );
        Vec_WecPush( vLevels, nArgA, 0 );

        Vec_WecPush( vProds,  nArgA+nArgB-1, 1 );
        Vec_WecPush( vLevels, nArgA+nArgB-1, 0 );
    }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, fSigned, fCla );
//    Wlc_BlastReduceMatrix2( pNew, vProds, vRes, fSigned, fCla );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}